

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::MarkScript
          (FunctionBody *this,ByteBlock *byteCodeBlock,ByteBlock *auxBlock,
          ByteBlock *auxContextBlock,uint byteCodeCount,uint byteCodeInLoopCount,
          uint byteCodeWithoutLDACount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  
  if (this->m_DEBUG_executionCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x514,"(m_DEBUG_executionCount == 0)",
                                "Function cannot be executing when modified");
    if (!bVar2) goto LAB_007674db;
    *puVar3 = 0;
  }
  if ((this->byteCodeBlock).ptr == (ByteBlock *)0x0) {
    pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxBlock);
    if (pvVar4 == (void *)0x0) {
      pvVar4 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxContextBlock);
      if (pvVar4 == (void *)0x0) goto LAB_00767423;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x504,
                              "((this->byteCodeBlock == nullptr) && (this->GetAuxiliaryData() == nullptr) && (this->GetAuxiliaryContextData() == nullptr))"
                              ,"Function body may only be set once");
  if (!bVar2) {
LAB_007674db:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00767423:
  SetCountField(this,ByteCodeCount,byteCodeCount);
  SetCountField(this,ByteCodeInLoopCount,byteCodeInLoopCount);
  SetCountField(this,ByteCodeWithoutLDACount,byteCodeWithoutLDACount);
  FunctionExecutionStateMachine::InitializeExecutionModeAndLimits(&this->executionState,this);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AuxBlock,auxBlock);
  FunctionProxy::SetAuxPtr((FunctionProxy *)this,AuxContextBlock,auxContextBlock);
  Memory::Recycler::WBSetBit((char *)&this->byteCodeBlock);
  (this->byteCodeBlock).ptr = byteCodeBlock;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->byteCodeBlock);
  if ((this->field_0x178 & 8) == 0) {
    Utf8SourceInfo::SetFunctionBody
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,this);
    return;
  }
  return;
}

Assistant:

void FunctionBody::MarkScript(ByteBlock *byteCodeBlock, ByteBlock* auxBlock, ByteBlock* auxContextBlock,
        uint byteCodeCount, uint byteCodeInLoopCount, uint byteCodeWithoutLDACount)
    {
        CheckNotExecuting();
        CheckEmpty();

#ifdef PERF_COUNTERS
        DWORD byteCodeSize = byteCodeBlock->GetLength()
            + (auxBlock? auxBlock->GetLength() : 0)
            + (auxContextBlock? auxContextBlock->GetLength() : 0);
        PERF_COUNTER_ADD(Code, DynamicByteCodeSize, byteCodeSize);
#endif

        SetByteCodeCount(byteCodeCount);
        SetByteCodeInLoopCount(byteCodeInLoopCount);
        SetByteCodeWithoutLDACount(byteCodeWithoutLDACount);

        executionState.InitializeExecutionModeAndLimits(this);

        this->SetAuxiliaryData(auxBlock);
        this->SetAuxiliaryContextData(auxContextBlock);

        // Memory barrier needed here to make sure the background codegen thread's inliner
        // gets all the assignment before it sees that the function has been parse
        MemoryBarrier();

        this->byteCodeBlock = byteCodeBlock;
        PERF_COUNTER_ADD(Code, TotalByteCodeSize, byteCodeSize);

        // If this is a defer parse function body, we would not have registered it
        // on the function bodies list so we should register it now
        if (!this->m_isFuncRegistered)
        {
            this->GetUtf8SourceInfo()->SetFunctionBody(this);
        }
    }